

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void * stbi__tga_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  uchar uVar1;
  stbi_uc asVar2 [4];
  int iVar3;
  uint x_00;
  uint uVar4;
  uint uVar5;
  int iVar6;
  byte *pbVar7;
  uint *puVar8;
  byte *pbVar9;
  long lVar10;
  stbi_uc sVar11;
  uint uVar12;
  char *pcVar13;
  uchar *puVar14;
  undefined4 uVar15;
  undefined8 unaff_RBP;
  uint uVar16;
  int iVar17;
  stbi_uc *psVar18;
  undefined4 uVar19;
  undefined8 unaff_R12;
  size_t sVar20;
  uint *data;
  ulong uVar21;
  long *in_FS_OFFSET;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  uchar raw_data [4];
  size_t local_80;
  stbi_uc local_74 [4];
  uint local_70;
  uint local_6c;
  undefined8 local_68;
  uint *local_60;
  undefined4 local_58;
  uint local_54;
  ulong local_50;
  uint *local_48;
  uint *local_40;
  undefined4 local_38;
  uint local_34;
  
  pbVar7 = s->img_buffer;
  pbVar9 = s->img_buffer_end;
  local_60 = (uint *)x;
  local_48 = (uint *)y;
  local_40 = (uint *)comp;
  local_34 = req_comp;
  if (pbVar7 < pbVar9) {
LAB_001ba8a9:
    s->img_buffer = pbVar7 + 1;
    local_68 = (stbi_uc *)CONCAT44(local_68._4_4_,(uint)*pbVar7);
    pbVar7 = pbVar7 + 1;
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      pbVar7 = s->img_buffer;
      pbVar9 = s->img_buffer_end;
      goto LAB_001ba8a9;
    }
    local_68 = (stbi_uc *)((ulong)local_68._4_4_ << 0x20);
  }
  if (pbVar7 < pbVar9) {
LAB_001ba8e4:
    s->img_buffer = pbVar7 + 1;
    uVar15 = (undefined4)CONCAT71((int7)((ulong)unaff_RBP >> 8),*pbVar7 != 0);
    pbVar7 = pbVar7 + 1;
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      pbVar7 = s->img_buffer;
      pbVar9 = s->img_buffer_end;
      goto LAB_001ba8e4;
    }
    uVar15 = 0;
  }
  if (pbVar7 < pbVar9) {
LAB_001ba918:
    s->img_buffer = pbVar7 + 1;
    local_6c = (uint)CONCAT71((int7)((ulong)pbVar7 >> 8),*pbVar7);
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      pbVar7 = s->img_buffer;
      goto LAB_001ba918;
    }
    local_6c = 0;
  }
  iVar3 = stbi__get16le(s);
  local_54 = stbi__get16le(s);
  pbVar9 = s->img_buffer;
  local_58 = uVar15;
  if (pbVar9 < s->img_buffer_end) {
LAB_001ba96f:
    s->img_buffer = pbVar9 + 1;
    uVar5 = (uint)*pbVar9;
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      pbVar9 = s->img_buffer;
      goto LAB_001ba96f;
    }
    uVar5 = 0;
  }
  stbi__get16le(s);
  stbi__get16le(s);
  x_00 = stbi__get16le(s);
  uVar4 = stbi__get16le(s);
  uVar21 = (ulong)uVar4;
  pbVar7 = s->img_buffer;
  pbVar9 = s->img_buffer_end;
  if (pbVar7 < pbVar9) {
LAB_001ba9d7:
    s->img_buffer = pbVar7 + 1;
    local_70 = (uint)CONCAT71((int7)((ulong)pbVar7 >> 8),*pbVar7);
    pbVar7 = pbVar7 + 1;
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      pbVar7 = s->img_buffer;
      pbVar9 = s->img_buffer_end;
      goto LAB_001ba9d7;
    }
    local_70 = 0;
  }
  if (pbVar7 < pbVar9) {
LAB_001baa0a:
    s->img_buffer = pbVar7 + 1;
    bVar23 = (*pbVar7 & 0x20) == 0;
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      pbVar7 = s->img_buffer;
      goto LAB_001baa0a;
    }
    bVar23 = true;
  }
  local_74[0] = '\0';
  local_74[1] = '\0';
  local_74[2] = '\0';
  local_74[3] = '\0';
  if ((char)local_58 != '\0') {
    if (uVar5 < 0x18) {
      if (uVar5 - 0xf < 2) {
LAB_001baab9:
        local_80 = 3;
        uVar15 = 1;
        uVar19 = 0;
        goto LAB_001bab1f;
      }
      if (uVar5 == 8) goto LAB_001bab13;
    }
    else if ((uVar5 == 0x18) || (uVar5 == 0x20)) {
      local_80 = (size_t)(uVar5 >> 3);
      goto LAB_001bab1d;
    }
LAB_001bac37:
    lVar10 = *in_FS_OFFSET;
    pcVar13 = "bad format";
    goto LAB_001bb00e;
  }
  uVar5 = local_70 & 0xff;
  if ((local_70 & 0xff) < 0x10) {
    if ((local_70 & 0xff) != 8) {
      if (uVar5 == 0xf) goto LAB_001baab9;
      goto LAB_001bac37;
    }
LAB_001bab13:
    local_80 = 1;
  }
  else if ((uVar5 == 0x20) || (uVar5 == 0x18)) {
    local_80 = (size_t)(byte)((byte)local_70 >> 3);
  }
  else {
    if (uVar5 != 0x10) goto LAB_001bac37;
    uVar5 = (local_6c & 0xff) - 8;
    if ((byte)local_6c < 8) {
      uVar5 = local_6c & 0xff;
    }
    if (uVar5 != 3) goto LAB_001baab9;
    local_80 = 2;
  }
LAB_001bab1d:
  uVar19 = (undefined4)CONCAT71((int7)((ulong)unaff_R12 >> 8),1);
  uVar15 = 0;
LAB_001bab1f:
  *local_60 = x_00;
  *local_48 = uVar4;
  uVar5 = (uint)local_80;
  if (local_40 != (uint *)0x0) {
    *local_40 = uVar5;
  }
  iVar6 = stbi__mad3sizes_valid(x_00,uVar4,uVar5,0);
  if (iVar6 == 0) {
    lVar10 = *in_FS_OFFSET;
    pcVar13 = "too large";
    goto LAB_001bb00e;
  }
  local_60 = (uint *)stbi__malloc_mad3(x_00,uVar4,uVar5,0);
  if (local_60 == (uint *)0x0) {
LAB_001baffb:
    lVar10 = *in_FS_OFFSET;
    pcVar13 = "outofmem";
    goto LAB_001bb00e;
  }
  local_48 = (uint *)CONCAT44(local_48._4_4_,uVar19);
  bVar22 = (byte)local_6c < 8;
  stbi__skip(s,(int)local_68);
  uVar12 = local_54;
  data = local_60;
  local_50 = uVar21;
  local_38 = uVar15;
  if (((char)local_58 == '\0' && (char)uVar15 == '\0') && bVar22) {
    if (uVar4 != 0) {
      uVar12 = 0;
      do {
        uVar4 = uVar4 - 1;
        uVar16 = uVar12;
        if (bVar23) {
          uVar16 = uVar4;
        }
        stbi__getn(s,(stbi_uc *)((long)data + (long)(int)(uVar16 * uVar5 * x_00)),uVar5 * x_00);
        uVar12 = uVar12 + 1;
      } while (uVar4 != 0);
    }
    goto LAB_001baf69;
  }
  if ((char)local_58 == '\0') {
    local_68 = (stbi_uc *)0x0;
    puVar8 = (uint *)local_68;
  }
  else {
    puVar8 = local_60;
    if (local_54 == 0) {
LAB_001bafd9:
      free(puVar8);
      lVar10 = *in_FS_OFFSET;
      pcVar13 = "bad palette";
LAB_001bb00e:
      *(char **)(lVar10 + -0x20) = pcVar13;
      return (void *)0x0;
    }
    stbi__skip(s,iVar3);
    puVar8 = (uint *)stbi__malloc_mad2(uVar12,uVar5,0);
    if (puVar8 == (uint *)0x0) {
      free(data);
      goto LAB_001baffb;
    }
    if ((char)local_48 == '\0') {
      psVar18 = (stbi_uc *)((long)puVar8 + 2);
      local_68 = (stbi_uc *)puVar8;
      do {
        uVar4 = stbi__get16le(s);
        psVar18[-2] = (stbi_uc)(((uVar4 >> 10 & 0x1f) * 0xff) / 0x1f);
        psVar18[-1] = (stbi_uc)(((uVar4 >> 5 & 0x1f) * 0xff) / 0x1f);
        *psVar18 = (stbi_uc)(((uVar4 & 0x1f) * 0xff) / 0x1f);
        psVar18 = psVar18 + local_80;
        uVar12 = uVar12 - 1;
      } while (uVar12 != 0);
      uVar4 = (uint)local_50;
      data = local_60;
      puVar8 = (uint *)local_68;
    }
    else {
      iVar3 = stbi__getn(s,(stbi_uc *)puVar8,uVar5 * uVar12);
      if (iVar3 == 0) {
        free(data);
        goto LAB_001bafd9;
      }
    }
  }
  local_68 = (stbi_uc *)puVar8;
  if (uVar4 * x_00 != 0) {
    local_40 = (uint *)(ulong)(uVar4 * x_00);
    bVar22 = true;
    puVar8 = (uint *)0x0;
    uVar4 = 0;
    iVar3 = 0;
    do {
      if ((byte)local_6c < 8) {
LAB_001bad53:
        if ((char)local_58 == '\0') {
          if ((char)local_48 == '\0') {
            uVar12 = stbi__get16le(s);
            asVar2 = local_74;
            local_74[1] = (char)(((uVar12 >> 5 & 0x1f) * 0xff) / 0x1f);
            local_74[0] = (char)(((uVar12 >> 10 & 0x1f) * 0xff) / 0x1f);
            local_74[3] = asVar2[3];
            local_74[2] = (char)(((uVar12 & 0x1f) * 0xff) / 0x1f);
          }
          else {
            if (uVar5 == 0) goto LAB_001baec6;
            psVar18 = s->img_buffer;
            sVar20 = 0;
            do {
              if (psVar18 < s->img_buffer_end) {
LAB_001badde:
                s->img_buffer = psVar18 + 1;
                sVar11 = *psVar18;
                psVar18 = psVar18 + 1;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  stbi__refill_buffer(s);
                  psVar18 = s->img_buffer;
                  goto LAB_001badde;
                }
                sVar11 = '\0';
              }
              local_74[sVar20] = sVar11;
              sVar20 = sVar20 + 1;
              data = local_60;
            } while (local_80 != sVar20);
          }
          goto LAB_001baea7;
        }
        if ((char)local_70 == '\b') {
          pbVar9 = s->img_buffer;
          if (s->img_buffer_end <= pbVar9) {
            if (s->read_from_callbacks == 0) {
              uVar12 = 0;
              goto LAB_001bae0e;
            }
            stbi__refill_buffer(s);
            pbVar9 = s->img_buffer;
          }
          s->img_buffer = pbVar9 + 1;
          uVar12 = (uint)*pbVar9;
        }
        else {
          uVar12 = stbi__get16le(s);
        }
LAB_001bae0e:
        if (uVar5 != 0) {
          if (local_54 <= uVar12) {
            uVar12 = 0;
          }
          memcpy(local_74,local_68 + uVar12 * uVar5,local_80);
          goto LAB_001baeae;
        }
      }
      else {
        if (iVar3 == 0) {
          pbVar9 = s->img_buffer;
          if (pbVar9 < s->img_buffer_end) {
LAB_001bad38:
            s->img_buffer = pbVar9 + 1;
            uVar4 = (uint)*pbVar9;
          }
          else {
            if (s->read_from_callbacks != 0) {
              stbi__refill_buffer(s);
              pbVar9 = s->img_buffer;
              goto LAB_001bad38;
            }
            uVar4 = 0;
          }
          iVar3 = (uVar4 & 0x7f) + 1;
          uVar4 = uVar4 >> 7;
          goto LAB_001bad53;
        }
        bVar24 = uVar4 != 0;
        uVar4 = 1;
        if (!bVar24 || bVar22) {
          uVar4 = (uint)bVar24;
          goto LAB_001bad53;
        }
LAB_001baea7:
        if (uVar5 != 0) {
LAB_001baeae:
          memcpy((stbi_uc *)((long)data + (ulong)(uVar5 * (int)puVar8)),local_74,local_80);
        }
      }
LAB_001baec6:
      iVar3 = iVar3 + -1;
      puVar8 = (uint *)((long)puVar8 + 1);
      bVar22 = false;
    } while (puVar8 != local_40);
  }
  if (bVar23 && (int)local_50 != 0) {
    iVar3 = uVar5 * x_00;
    uVar12 = (int)local_50 - 1;
    iVar6 = iVar3 * uVar12;
    uVar16 = 0;
    uVar4 = 0;
    do {
      if (iVar3 != 0) {
        psVar18 = (stbi_uc *)data;
        iVar17 = iVar3 + 1;
        do {
          sVar11 = psVar18[uVar16];
          psVar18[uVar16] = psVar18[iVar6];
          psVar18[iVar6] = sVar11;
          psVar18 = psVar18 + 1;
          iVar17 = iVar17 + -1;
        } while (1 < iVar17);
      }
      iVar6 = iVar6 - iVar3;
      uVar16 = uVar16 + iVar3;
      bVar23 = uVar4 != uVar12 >> 1;
      uVar4 = uVar4 + 1;
    } while (bVar23);
  }
  if (local_68 != (stbi_uc *)0x0) {
    free(local_68);
  }
LAB_001baf69:
  if (((char)local_38 == '\0' && 2 < uVar5) && (iVar3 = (uint)local_50 * x_00, iVar3 != 0)) {
    puVar14 = (uchar *)((long)data + 2);
    do {
      uVar1 = puVar14[-2];
      puVar14[-2] = *puVar14;
      *puVar14 = uVar1;
      puVar14 = puVar14 + local_80;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  if (local_34 == 0) {
    return (uchar *)data;
  }
  if (uVar5 == local_34) {
    return (uchar *)data;
  }
  puVar14 = stbi__convert_format((uchar *)data,uVar5,local_34,x_00,(uint)local_50);
  return puVar14;
}

Assistant:

static void *stbi__tga_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   //   read in the TGA header stuff
   int tga_offset = stbi__get8(s);
   int tga_indexed = stbi__get8(s);
   int tga_image_type = stbi__get8(s);
   int tga_is_RLE = 0;
   int tga_palette_start = stbi__get16le(s);
   int tga_palette_len = stbi__get16le(s);
   int tga_palette_bits = stbi__get8(s);
   int tga_x_origin = stbi__get16le(s);
   int tga_y_origin = stbi__get16le(s);
   int tga_width = stbi__get16le(s);
   int tga_height = stbi__get16le(s);
   int tga_bits_per_pixel = stbi__get8(s);
   int tga_comp, tga_rgb16=0;
   int tga_inverted = stbi__get8(s);
   // int tga_alpha_bits = tga_inverted & 15; // the 4 lowest bits - unused (useless?)
   //   image data
   unsigned char *tga_data;
   unsigned char *tga_palette = NULL;
   int i, j;
   unsigned char raw_data[4] = {0};
   int RLE_count = 0;
   int RLE_repeating = 0;
   int read_next_pixel = 1;
   STBI_NOTUSED(ri);
   STBI_NOTUSED(tga_x_origin); // @TODO
   STBI_NOTUSED(tga_y_origin); // @TODO

   if (tga_height > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");
   if (tga_width > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");

   //   do a tiny bit of precessing
   if ( tga_image_type >= 8 )
   {
      tga_image_type -= 8;
      tga_is_RLE = 1;
   }
   tga_inverted = 1 - ((tga_inverted >> 5) & 1);

   //   If I'm paletted, then I'll use the number of bits from the palette
   if ( tga_indexed ) tga_comp = stbi__tga_get_comp(tga_palette_bits, 0, &tga_rgb16);
   else tga_comp = stbi__tga_get_comp(tga_bits_per_pixel, (tga_image_type == 3), &tga_rgb16);

   if(!tga_comp) // shouldn't really happen, stbi__tga_test() should have ensured basic consistency
      return stbi__errpuc("bad format", "Can't find out TGA pixelformat");

   //   tga info
   *x = tga_width;
   *y = tga_height;
   if (comp) *comp = tga_comp;

   if (!stbi__mad3sizes_valid(tga_width, tga_height, tga_comp, 0))
      return stbi__errpuc("too large", "Corrupt TGA");

   tga_data = (unsigned char*)stbi__malloc_mad3(tga_width, tga_height, tga_comp, 0);
   if (!tga_data) return stbi__errpuc("outofmem", "Out of memory");

   // skip to the data's starting position (offset usually = 0)
   stbi__skip(s, tga_offset );

   if ( !tga_indexed && !tga_is_RLE && !tga_rgb16 ) {
      for (i=0; i < tga_height; ++i) {
         int row = tga_inverted ? tga_height -i - 1 : i;
         stbi_uc *tga_row = tga_data + row*tga_width*tga_comp;
         stbi__getn(s, tga_row, tga_width * tga_comp);
      }
   } else  {
      //   do I need to load a palette?
      if ( tga_indexed)
      {
         if (tga_palette_len == 0) {  /* you have to have at least one entry! */
            STBI_FREE(tga_data);
            return stbi__errpuc("bad palette", "Corrupt TGA");
         }

         //   any data to skip? (offset usually = 0)
         stbi__skip(s, tga_palette_start );
         //   load the palette
         tga_palette = (unsigned char*)stbi__malloc_mad2(tga_palette_len, tga_comp, 0);
         if (!tga_palette) {
            STBI_FREE(tga_data);
            return stbi__errpuc("outofmem", "Out of memory");
         }
         if (tga_rgb16) {
            stbi_uc *pal_entry = tga_palette;
            STBI_ASSERT(tga_comp == STBI_rgb);
            for (i=0; i < tga_palette_len; ++i) {
               stbi__tga_read_rgb16(s, pal_entry);
               pal_entry += tga_comp;
            }
         } else if (!stbi__getn(s, tga_palette, tga_palette_len * tga_comp)) {
               STBI_FREE(tga_data);
               STBI_FREE(tga_palette);
               return stbi__errpuc("bad palette", "Corrupt TGA");
         }
      }
      //   load the data
      for (i=0; i < tga_width * tga_height; ++i)
      {
         //   if I'm in RLE mode, do I need to get a RLE stbi__pngchunk?
         if ( tga_is_RLE )
         {
            if ( RLE_count == 0 )
            {
               //   yep, get the next byte as a RLE command
               int RLE_cmd = stbi__get8(s);
               RLE_count = 1 + (RLE_cmd & 127);
               RLE_repeating = RLE_cmd >> 7;
               read_next_pixel = 1;
            } else if ( !RLE_repeating )
            {
               read_next_pixel = 1;
            }
         } else
         {
            read_next_pixel = 1;
         }
         //   OK, if I need to read a pixel, do it now
         if ( read_next_pixel )
         {
            //   load however much data we did have
            if ( tga_indexed )
            {
               // read in index, then perform the lookup
               int pal_idx = (tga_bits_per_pixel == 8) ? stbi__get8(s) : stbi__get16le(s);
               if ( pal_idx >= tga_palette_len ) {
                  // invalid index
                  pal_idx = 0;
               }
               pal_idx *= tga_comp;
               for (j = 0; j < tga_comp; ++j) {
                  raw_data[j] = tga_palette[pal_idx+j];
               }
            } else if(tga_rgb16) {
               STBI_ASSERT(tga_comp == STBI_rgb);
               stbi__tga_read_rgb16(s, raw_data);
            } else {
               //   read in the data raw
               for (j = 0; j < tga_comp; ++j) {
                  raw_data[j] = stbi__get8(s);
               }
            }
            //   clear the reading flag for the next pixel
            read_next_pixel = 0;
         } // end of reading a pixel

         // copy data
         for (j = 0; j < tga_comp; ++j)
           tga_data[i*tga_comp+j] = raw_data[j];

         //   in case we're in RLE mode, keep counting down
         --RLE_count;
      }
      //   do I need to invert the image?
      if ( tga_inverted )
      {
         for (j = 0; j*2 < tga_height; ++j)
         {
            int index1 = j * tga_width * tga_comp;
            int index2 = (tga_height - 1 - j) * tga_width * tga_comp;
            for (i = tga_width * tga_comp; i > 0; --i)
            {
               unsigned char temp = tga_data[index1];
               tga_data[index1] = tga_data[index2];
               tga_data[index2] = temp;
               ++index1;
               ++index2;
            }
         }
      }
      //   clear my palette, if I had one
      if ( tga_palette != NULL )
      {
         STBI_FREE( tga_palette );
      }
   }

   // swap RGB - if the source data was RGB16, it already is in the right order
   if (tga_comp >= 3 && !tga_rgb16)
   {
      unsigned char* tga_pixel = tga_data;
      for (i=0; i < tga_width * tga_height; ++i)
      {
         unsigned char temp = tga_pixel[0];
         tga_pixel[0] = tga_pixel[2];
         tga_pixel[2] = temp;
         tga_pixel += tga_comp;
      }
   }

   // convert to target component count
   if (req_comp && req_comp != tga_comp)
      tga_data = stbi__convert_format(tga_data, tga_comp, req_comp, tga_width, tga_height);

   //   the things I do to get rid of an error message, and yet keep
   //   Microsoft's C compilers happy... [8^(
   tga_palette_start = tga_palette_len = tga_palette_bits =
         tga_x_origin = tga_y_origin = 0;
   STBI_NOTUSED(tga_palette_start);
   //   OK, done
   return tga_data;
}